

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::SparseNode::MergePartialFromCodedStream
          (SparseNode *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  double *pdVar3;
  uint32 uVar4;
  uint uVar5;
  double in_RAX;
  int iVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  double local_38;
  
  local_38 = in_RAX;
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003cadd4;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003cadd4:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar7 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar4 | uVar7;
    }
    uVar4 = (uint32)uVar7;
    iVar8 = 6;
    iVar6 = iVar8;
    if ((uVar7 & 0x100000000) == 0) {
LAB_003cae52:
      iVar6 = 7;
      if (((uVar4 & 7) != 4 && uVar4 != 0) &&
         (bVar9 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4), iVar6 = iVar8,
         bVar9)) goto LAB_003cae77;
    }
    else {
      uVar5 = (uint)(uVar7 >> 3) & 0x1fffffff;
      if (uVar5 == 2) {
        if ((char)uVar7 != '\x11') goto LAB_003cae52;
        pdVar3 = (double *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pdVar3 < 8) {
          bVar9 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                            (input,(uint64 *)&local_38);
          if (!bVar9) goto LAB_003cae79;
        }
        else {
          local_38 = *pdVar3;
          input->buffer_ = (uint8 *)(pdVar3 + 1);
        }
        this->value_ = local_38;
        goto LAB_003cae77;
      }
      if ((uVar5 != 1) || ((char)uVar7 != '\b')) goto LAB_003cae52;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar7 = (ulong)bVar1;
        uVar4 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003cae85;
        input->buffer_ = pbVar2 + 1;
        bVar9 = true;
      }
      else {
        uVar4 = 0;
LAB_003cae85:
        uVar7 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
        bVar9 = -1 < (long)uVar7;
      }
      if (bVar9) {
        this->index_ = (int32)uVar7;
LAB_003cae77:
        iVar6 = 0;
      }
    }
LAB_003cae79:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool SparseNode::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SparseNode)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int32 index = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &index_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double value = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(17u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &value_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SparseNode)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SparseNode)
  return false;
#undef DO_
}